

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# base_function.hpp
# Opt level: O2

double __thiscall sisl::function::eval(function *this,double d0,...)

{
  Scalar SVar1;
  char in_AL;
  Scalar *pSVar2;
  undefined8 in_RCX;
  ulong uVar3;
  undefined8 in_RDX;
  undefined8 in_RSI;
  undefined8 in_R8;
  undefined8 in_R9;
  int i;
  long index;
  double extraout_XMM0_Qa;
  undefined8 in_XMM1_Qa;
  undefined8 in_XMM2_Qa;
  undefined8 in_XMM3_Qa;
  undefined8 in_XMM4_Qa;
  undefined8 in_XMM5_Qa;
  undefined8 in_XMM6_Qa;
  undefined8 in_XMM7_Qa;
  int n;
  va_list args;
  vector p;
  undefined1 local_c8 [8];
  undefined8 local_c0;
  undefined8 local_b8;
  undefined8 local_b0;
  undefined8 local_a8;
  undefined8 local_a0;
  undefined8 local_88;
  undefined8 local_78;
  undefined8 local_68;
  undefined8 local_58;
  undefined8 local_48;
  undefined8 local_38;
  undefined8 local_28;
  
  if (in_AL != '\0') {
    local_88 = in_XMM1_Qa;
    local_78 = in_XMM2_Qa;
    local_68 = in_XMM3_Qa;
    local_58 = in_XMM4_Qa;
    local_48 = in_XMM5_Qa;
    local_38 = in_XMM6_Qa;
    local_28 = in_XMM7_Qa;
  }
  local_c0 = in_RSI;
  local_b8 = in_RDX;
  local_b0 = in_RCX;
  local_a8 = in_R8;
  local_a0 = in_R9;
  n = (*this->_vptr_function[0xc])();
  Eigen::Matrix<double,_-1,_1,_0,_-1,_1>::Matrix<int>((Matrix<double,__1,_1,_0,__1,_1> *)&p,&n);
  pSVar2 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_1>::operator[]
                     ((DenseCoeffsBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_1> *)&p,0);
  *pSVar2 = d0;
  args[0].reg_save_area = local_c8;
  args[0].overflow_arg_area = &stack0x00000008;
  args[0].gp_offset = 8;
  args[0].fp_offset = 0x40;
  for (index = 1; index < n; index = index + 1) {
    uVar3 = (ulong)args[0].fp_offset;
    if (uVar3 < 0xa1) {
      args[0].fp_offset = args[0].fp_offset + 0x10;
      pSVar2 = (Scalar *)(uVar3 + (long)args[0].reg_save_area);
    }
    else {
      pSVar2 = (Scalar *)args[0].overflow_arg_area;
      args[0].overflow_arg_area = (void *)((long)args[0].overflow_arg_area + 8);
    }
    SVar1 = *pSVar2;
    pSVar2 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_1>::operator[]
                       ((DenseCoeffsBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_1> *)&p,index);
    *pSVar2 = SVar1;
  }
  (*this->_vptr_function[3])(this,&p);
  free(p.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_data);
  return extraout_XMM0_Qa;
}

Assistant:

virtual const double eval(double d0, ...) {
        	va_list args;  
        	int n = this->dim();
        	vector p(n);

        	p[0] = d0;
			va_start(args, d0);  
        	for(int i = 1; i < n; i++) {
        		p[i] = va_arg (args, double);
        	}
        	va_end (args);
        	return this->operator()(p);
        }